

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

void __thiscall pbrt::BDPTIntegrator::Render(BDPTIntegrator *this)

{
  Bounds2i pixelBounds;
  bool bVar1;
  Tuple2<pbrt::Point2,_int> fullResolution;
  size_type sVar2;
  TaggedPointer *this_00;
  long in_RDI;
  ImageMetadata metadata;
  size_t i;
  Float invSampleCount;
  FilmBaseParameters p;
  string filename;
  int t;
  int s;
  int depth;
  int bufferCount;
  ImageTileIntegrator *in_stack_00000ba8;
  RGBFilm *in_stack_fffffffffffffc08;
  ImageMetadata *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  PixelSensor *in_stack_fffffffffffffc20;
  size_type sVar3;
  ImageMetadata *in_stack_fffffffffffffc28;
  Float FVar4;
  undefined4 in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc34;
  FilmBaseParameters *in_stack_fffffffffffffc38;
  int *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  float in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc58;
  Float in_stack_fffffffffffffc5c;
  ImageMetadata *in_stack_fffffffffffffc60;
  Allocator in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffcc3;
  Float in_stack_fffffffffffffcc4;
  RGBColorSpace *in_stack_fffffffffffffcc8;
  FilmBaseParameters *in_stack_fffffffffffffcd0;
  RGBFilm *in_stack_fffffffffffffcd8;
  Allocator in_stack_fffffffffffffce0;
  size_type local_180;
  undefined1 local_110 [76];
  Tuple2<pbrt::Point2,_int> local_c4;
  Tuple2<pbrt::Point2,_int> local_90;
  string local_38 [32];
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  if (((*(byte *)(in_RDI + 0x6c) & 1) != 0) || ((*(byte *)(in_RDI + 0x6d) & 1) != 0)) {
    local_c = ((*(int *)(in_RDI + 0x68) + 1) * (*(int *)(in_RDI + 0x68) + 6)) / 2;
    std::vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>::resize
              ((vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               (size_type)in_stack_fffffffffffffc28);
    for (local_10 = 0; local_10 <= *(int *)(in_RDI + 0x68); local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 <= local_10 + 2; local_14 = local_14 + 1) {
        local_18 = (local_10 + 2) - local_14;
        if ((local_18 != 0) && ((local_14 != 1 || (local_18 != 1)))) {
          StringPrintf<int&,int&,int&>
                    ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     in_stack_fffffffffffffc40,(int *)in_stack_fffffffffffffc38,
                     (int *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
          FVar4 = (Float)((ulong)in_stack_fffffffffffffc28 >> 0x20);
          CameraHandle::GetFilm
                    ((CameraHandle *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
          local_90 = (Tuple2<pbrt::Point2,_int>)
                     FilmHandle::FullResolution((FilmHandle *)in_stack_fffffffffffffc08);
          Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffc10,
                              (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                              (int)in_stack_fffffffffffffc08);
          CameraHandle::GetFilm
                    ((CameraHandle *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
          local_c4 = (Tuple2<pbrt::Point2,_int>)
                     FilmHandle::FullResolution((FilmHandle *)in_stack_fffffffffffffc08);
          Bounds2<int>::Bounds2
                    ((Bounds2<int> *)in_stack_fffffffffffffc20,
                     (Point2<int> *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                     (Point2<int> *)in_stack_fffffffffffffc10);
          in_stack_fffffffffffffc60 = (ImageMetadata *)operator_new(8);
          Vector2<float>::Vector2
                    ((Vector2<float> *)in_stack_fffffffffffffc10,
                     (float)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                     SUB84(in_stack_fffffffffffffc08,0));
          BoxFilter::BoxFilter
                    ((BoxFilter *)in_stack_fffffffffffffc60,(Vector2f *)(local_110 + 0x30));
          FilterHandle::TaggedPointer<pbrt::BoxFilter>
                    ((FilterHandle *)in_stack_fffffffffffffc10,
                     (BoxFilter *)in_stack_fffffffffffffc08);
          CameraHandle::GetFilm
                    ((CameraHandle *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
          in_stack_fffffffffffffc5c = FilmHandle::Diagonal((FilmHandle *)in_stack_fffffffffffffc10);
          in_stack_fffffffffffffc4c = in_stack_fffffffffffffc5c * 1000.0;
          pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                    ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffc10);
          fullResolution =
               (Tuple2<pbrt::Point2,_int>)PixelSensor::CreateDefault(in_stack_fffffffffffffca0);
          std::__cxx11::string::string((string *)local_110,local_38);
          in_stack_fffffffffffffc08 = (RGBFilm *)local_110;
          pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffc48;
          pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int> =
               (Tuple2<pbrt::Point2,_int>)in_stack_fffffffffffffc40;
          pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffffc4c;
          FilmBaseParameters::FilmBaseParameters
                    (in_stack_fffffffffffffc38,(Point2i)fullResolution,pixelBounds,
                     (FilterHandle *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     FVar4,in_stack_fffffffffffffc20,(string *)in_stack_fffffffffffffc60);
          std::__cxx11::string::~string((string *)local_110);
          in_stack_fffffffffffffc40 = (int *)operator_new(0xa8);
          FilmBaseParameters::FilmBaseParameters
                    ((FilmBaseParameters *)in_stack_fffffffffffffc10,
                     (FilmBaseParameters *)in_stack_fffffffffffffc08);
          in_stack_fffffffffffffc38 = RGBColorSpace::sRGB;
          pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                    ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffc10);
          RGBFilm::RGBFilm(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                           in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4,
                           (bool)in_stack_fffffffffffffcc3,in_stack_fffffffffffffce0);
          FilmHandle::TaggedPointer<pbrt::RGBFilm>
                    ((FilmHandle *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          in_stack_fffffffffffffc28 = (ImageMetadata *)(in_RDI + 0xa0);
          in_stack_fffffffffffffc34 = BufferIndex(local_14,local_18);
          std::vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>::operator[]
                    ((vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_> *)
                     in_stack_fffffffffffffc28,(long)in_stack_fffffffffffffc34);
          FilmHandle::operator=
                    ((FilmHandle *)in_stack_fffffffffffffc10,(FilmHandle *)in_stack_fffffffffffffc08
                    );
          FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x7eea2c);
          FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x7eea39);
          std::__cxx11::string::~string(local_38);
        }
      }
    }
  }
  ImageTileIntegrator::Render(in_stack_00000ba8);
  if (((*(byte *)(in_RDI + 0x6c) & 1) != 0) || ((*(byte *)(in_RDI + 0x6d) & 1) != 0)) {
    SamplerHandle::SamplesPerPixel((SamplerHandle *)in_stack_fffffffffffffc10);
    local_180 = 0;
    while (sVar3 = local_180,
          sVar2 = std::vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>::size
                            ((vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_> *)
                             (in_RDI + 0xa0)), sVar3 < sVar2) {
      ImageMetadata::ImageMetadata(in_stack_fffffffffffffc10);
      FVar4 = (Float)(sVar3 >> 0x20);
      this_00 = (TaggedPointer *)
                std::vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>::operator[]
                          ((vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_> *)
                           (in_RDI + 0xa0),local_180);
      bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(this_00);
      if (bVar1) {
        in_stack_fffffffffffffc10 =
             (ImageMetadata *)
             std::vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>::operator[]
                       ((vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_> *)
                        (in_RDI + 0xa0),local_180);
        ImageMetadata::ImageMetadata
                  (in_stack_fffffffffffffc60,
                   (ImageMetadata *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        FilmHandle::WriteImage
                  ((FilmHandle *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   in_stack_fffffffffffffc28,FVar4);
        ImageMetadata::~ImageMetadata(in_stack_fffffffffffffc10);
      }
      ImageMetadata::~ImageMetadata(in_stack_fffffffffffffc10);
      local_180 = local_180 + 1;
    }
    std::vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>::clear
              ((vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_> *)0x7eecfe);
  }
  return;
}

Assistant:

void BDPTIntegrator::Render() {
    // Allocate buffers for debug visualization
    if (visualizeStrategies || visualizeWeights) {
        const int bufferCount = (1 + maxDepth) * (6 + maxDepth) / 2;
        weightFilms.resize(bufferCount);
        for (int depth = 0; depth <= maxDepth; ++depth) {
            for (int s = 0; s <= depth + 2; ++s) {
                int t = depth + 2 - s;
                if (t == 0 || (s == 1 && t == 1))
                    continue;

                std::string filename =
                    StringPrintf("bdpt_d%02i_s%02i_t%02i.exr", depth, s, t);

                FilmBaseParameters p(
                    camera.GetFilm().FullResolution(),
                    Bounds2i(Point2i(0, 0), camera.GetFilm().FullResolution()),
                    new BoxFilter,  // FIXME: leaks
                    camera.GetFilm().Diagonal() * 1000, PixelSensor::CreateDefault(),
                    filename);
                weightFilms[BufferIndex(s, t)] = new RGBFilm(p, RGBColorSpace::sRGB);
            }
        }
    }

    RayIntegrator::Render();

    // Write buffers for debug visualization
    if (visualizeStrategies || visualizeWeights) {
        const Float invSampleCount = 1.0f / samplerPrototype.SamplesPerPixel();
        for (size_t i = 0; i < weightFilms.size(); ++i) {
            ImageMetadata metadata;
            if (weightFilms[i])
                weightFilms[i].WriteImage(metadata, invSampleCount);
        }
        weightFilms.clear();
    }
}